

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::RegisterProcessForMonitoring
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CSynchData *psdSynchData,
          CProcProcessLocalData *pProcLocalData)

{
  PAL_ERROR PVar1;
  _MonitoredProcessesListNode *p_Var2;
  int *piVar3;
  PAL_ERROR PVar4;
  MonitoredProcessesListNode *pMVar5;
  LONG *pLVar6;
  
  InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  pMVar5 = (MonitoredProcessesListNode *)&this->m_pmplnMonitoredProcesses;
  do {
    pMVar5 = pMVar5->pNext;
    if (pMVar5 == (MonitoredProcessesListNode *)0x0) {
      p_Var2 = InternalNew<CorUnix::CPalSynchronizationManager::_MonitoredProcessesListNode>();
      if (p_Var2 == (_MonitoredProcessesListNode *)0x0) {
        if (PAL_InitializeChakraCoreCalled != false) {
          InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
          return 8;
        }
        goto LAB_0033c380;
      }
      p_Var2->lRefCount = 1;
      p_Var2->dwPid = *(DWORD *)pProcLocalData;
      p_Var2->dwExitCode = 0;
      p_Var2->pProcLocalData = pProcLocalData;
      p_Var2->psdSynchData = psdSynchData;
      LOCK();
      psdSynchData->m_lRefCount = psdSynchData->m_lRefCount + 1;
      UNLOCK();
      p_Var2->pNext = this->m_pmplnMonitoredProcesses;
      this->m_pmplnMonitoredProcesses = p_Var2;
      pLVar6 = &this->m_lMonitoredProcessesCount;
      goto LAB_0033c302;
    }
  } while (pMVar5->psdSynchData != psdSynchData);
  if (pMVar5->dwPid != *(DWORD *)pProcLocalData) {
    fprintf(_stderr,"] %s %s:%d","RegisterProcessForMonitoring",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xb72);
    fprintf(_stderr,
            "Expression: pmpln->dwPid == pProcLocalData->dwProcessId, Description: Invalid node in Monitored Processes List\n"
           );
  }
  pLVar6 = &pMVar5->lRefCount;
LAB_0033c302:
  *pLVar6 = *pLVar6 + 1;
  InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  PVar4 = 0;
  if (pMVar5 == (MonitoredProcessesListNode *)0x0) {
    PVar4 = 0;
    PVar1 = WakeUpLocalWorkerThread(s_pObjSynchMgr,SynchWorkerCmdNop);
    if (PVar1 != 0) {
      if (PAL_InitializeChakraCoreCalled == false) {
LAB_0033c380:
        abort();
      }
      piVar3 = __errno_location();
      strerror(*piVar3);
      PVar4 = 0x54f;
    }
  }
  return PVar4;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::RegisterProcessForMonitoring(
        CPalThread * pthrCurrent,
        CSynchData *psdSynchData,
        CProcProcessLocalData * pProcLocalData)
    {
        PAL_ERROR palErr = NO_ERROR;
        MonitoredProcessesListNode * pmpln;
        bool fWakeUpWorker = false;
        bool fMonitoredProcessesLock = false;

        VALIDATEOBJECT(psdSynchData);

        InternalEnterCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        fMonitoredProcessesLock = true;

        pmpln = m_pmplnMonitoredProcesses;
        while (pmpln)
        {
            if (psdSynchData == pmpln->psdSynchData)
            {
                _ASSERT_MSG(pmpln->dwPid == pProcLocalData->dwProcessId,
                            "Invalid node in Monitored Processes List\n");
                break;
            }

            pmpln = pmpln->pNext;
        }

        if (pmpln)
        {
            pmpln->lRefCount++;
        }
        else
        {
            pmpln = InternalNew<MonitoredProcessesListNode>();
            if (NULL == pmpln)
            {
                ERROR("No memory to allocate MonitoredProcessesListNode structure\n");
                palErr = ERROR_NOT_ENOUGH_MEMORY;
                goto RPFM_exit;
            }

            pmpln->lRefCount      = 1;
            pmpln->dwPid          = pProcLocalData->dwProcessId;
            pmpln->dwExitCode     = 0;
            pmpln->pProcLocalData = pProcLocalData;

            // Acquire SynchData and AddRef it
            pmpln->psdSynchData = psdSynchData;
            psdSynchData->AddRef();

            pmpln->pNext = m_pmplnMonitoredProcesses;
            m_pmplnMonitoredProcesses = pmpln;
            m_lMonitoredProcessesCount++;

            fWakeUpWorker = true;
        }
        // Unlock
        InternalLeaveCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        fMonitoredProcessesLock = false;

        if (fWakeUpWorker)
        {
            CPalSynchronizationManager * pSynchManager = GetInstance();

            palErr = pSynchManager->WakeUpLocalWorkerThread(SynchWorkerCmdNop);
            if (NO_ERROR != palErr)
            {
                ERROR("Failed waking up worker thread for process "
                      "monitoring registration [errno=%d {%s%}]\n",
                      errno, strerror(errno));
                palErr = ERROR_INTERNAL_ERROR;
            }
        }

    RPFM_exit:
        if (fMonitoredProcessesLock)
        {
            InternalLeaveCriticalSection(pthrCurrent,
                                         &s_csMonitoredProcessesLock);
        }
        return palErr;
    }